

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSModuleDef * js_host_resolve_imported_module(JSContext *ctx,char *base_cname,char *cname1)

{
  char cVar1;
  JSRuntime *pJVar2;
  JSAtom name;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  JSModuleDef *pJVar7;
  char *pcVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  JSValue JVar11;
  
  pJVar2 = ctx->rt;
  if (pJVar2->module_normalize_func == (JSModuleNormalizeFunc *)0x0) {
    if (*cname1 == '.') {
      pcVar3 = strrchr(base_cname,0x2f);
      sVar9 = (size_t)((int)pcVar3 - (int)base_cname);
      if (pcVar3 == (char *)0x0) {
        sVar9 = 0;
      }
      sVar4 = strlen(cname1);
      pcVar3 = (char *)js_malloc(ctx,sVar4 + sVar9 + 2);
      if (pcVar3 == (char *)0x0) {
        return (JSModuleDef *)0x0;
      }
      memcpy(pcVar3,base_cname,sVar9);
      pcVar3[sVar9] = '\0';
      for (; *cname1 == '.'; cname1 = cname1 + lVar6) {
        lVar6 = 2;
        if (cname1[1] != '/') {
          if ((cname1[1] != '.') || (cname1[2] != '/')) break;
          if (*pcVar3 == '\0') goto LAB_001253dd;
          pcVar5 = strrchr(pcVar3,0x2f);
          pcVar8 = pcVar5 + 1;
          if (pcVar5 == (char *)0x0) {
            pcVar8 = pcVar3;
          }
          if (*pcVar8 == '.') {
            cVar1 = pcVar8[1];
            if (cVar1 == '.') {
              cVar1 = pcVar8[2];
            }
            if (cVar1 == '\0') break;
          }
          pcVar8[-(ulong)(pcVar3 < pcVar8)] = '\0';
          lVar6 = 3;
        }
      }
      if (*pcVar3 != '\0') {
        sVar9 = strlen(pcVar3);
        (pcVar3 + sVar9)[0] = '/';
        (pcVar3 + sVar9)[1] = '\0';
      }
LAB_001253dd:
      strcat(pcVar3,cname1);
      goto LAB_0012533e;
    }
    pcVar3 = js_strdup(ctx,cname1);
  }
  else {
    pcVar3 = (*pJVar2->module_normalize_func)(ctx,base_cname,cname1,pJVar2->module_loader_opaque);
  }
  if (pcVar3 == (char *)0x0) {
    return (JSModuleDef *)0x0;
  }
LAB_0012533e:
  name = JS_NewAtom(ctx,pcVar3);
  if (name == 0) {
    (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,pcVar3);
    return (JSModuleDef *)0x0;
  }
  pJVar7 = js_find_loaded_module(ctx,name);
  if (pJVar7 == (JSModuleDef *)0x0) {
    JS_FreeAtom(ctx,name);
    if (pJVar2->module_loader_func == (JSModuleLoaderFunc *)0x0) {
      JVar11 = JS_ThrowReferenceError(ctx,"could not load module \'%s\'",pcVar3);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = JVar11.tag;
      auVar10 = auVar10 << 0x40;
    }
    else {
      auVar10 = (undefined1  [16])
                (*pJVar2->module_loader_func)(ctx,pcVar3,pJVar2->module_loader_opaque);
    }
    (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,pcVar3);
    return auVar10._0_8_;
  }
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,pcVar3);
  JS_FreeAtom(ctx,name);
  return pJVar7;
}

Assistant:

static JSModuleDef *js_host_resolve_imported_module(JSContext *ctx,
                                                    const char *base_cname,
                                                    const char *cname1)
{
    JSRuntime *rt = ctx->rt;
    JSModuleDef *m;
    char *cname;
    JSAtom module_name;

    if (!rt->module_normalize_func) {
        cname = js_default_module_normalize_name(ctx, base_cname, cname1);
    } else {
        cname = rt->module_normalize_func(ctx, base_cname, cname1,
                                          rt->module_loader_opaque);
    }
    if (!cname)
        return NULL;

    module_name = JS_NewAtom(ctx, cname);
    if (module_name == JS_ATOM_NULL) {
        js_free(ctx, cname);
        return NULL;
    }

    /* first look at the loaded modules */
    m = js_find_loaded_module(ctx, module_name);
    if (m) {
        js_free(ctx, cname);
        JS_FreeAtom(ctx, module_name);
        return m;
    }

    JS_FreeAtom(ctx, module_name);

    /* load the module */
    if (!rt->module_loader_func) {
        /* XXX: use a syntax error ? */
        JS_ThrowReferenceError(ctx, "could not load module '%s'",
                               cname);
        js_free(ctx, cname);
        return NULL;
    }

    m = rt->module_loader_func(ctx, cname, rt->module_loader_opaque);
    js_free(ctx, cname);
    return m;
}